

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O3

void write_local_cert(scep *s)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  X509 *pXVar4;
  X509_NAME *pXVar5;
  char *pcVar6;
  char *pcVar7;
  X509_NAME *b;
  FILE *pFVar8;
  FILE *pFVar9;
  ASN1_INTEGER *x;
  FILE *fp;
  BIO *bp;
  PKCS7 *pPVar10;
  X509_EXTENSION *pXVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 uVar14;
  char *unaff_RBP;
  FILE *pFVar15;
  int *piVar16;
  long lVar17;
  X509 *pXVar18;
  char **unaff_R14;
  ulong uVar19;
  FILE *unaff_R15;
  char buffer [1024];
  char cert_buf [1024];
  char buffer_1 [1024];
  uint uStack_1d04;
  PKCS7 *pPStack_1d00;
  BIO *pBStack_1cf8;
  long lStack_1cf0;
  byte abStack_1ce8 [64];
  char acStack_1ca8 [1024];
  char acStack_18a8 [1032];
  FILE *pFStack_14a0;
  int *piStack_1498;
  X509 *pXStack_1490;
  FILE *pFStack_1488;
  char **ppcStack_1480;
  code *pcStack_1478;
  int aiStack_1470 [258];
  FILE *pFStack_1068;
  int *piStack_1060;
  X509 *pXStack_1058;
  char **ppcStack_1050;
  FILE *pFStack_1048;
  code *pcStack_1040;
  char acStack_1038 [1024];
  char local_c38 [1024];
  char local_838 [2056];
  
  localcert = (X509 *)0x0;
  pFVar9 = (FILE *)((s->reply_p7->d).data)->flags;
  if (v_flag != 0) {
    pcStack_1040 = (code *)0x10d9f7;
    uVar2 = OPENSSL_sk_num(pFVar9);
    pcStack_1040 = (code *)0x10da07;
    printf("write_local_cert(): found %d cert(s)\n",(ulong)uVar2);
  }
  pcStack_1040 = (code *)0x10da0f;
  pFVar15 = pFVar9;
  iVar3 = OPENSSL_sk_num();
  pXVar4 = (X509 *)localcert;
  if (0 < iVar3) {
    unaff_R14 = (char **)0x0;
    do {
      pcStack_1040 = (code *)0x10da25;
      pXVar4 = (X509 *)OPENSSL_sk_value(pFVar9,unaff_R14);
      pcVar7 = pname;
      if (v_flag != 0) {
        pcStack_1040 = (code *)0x10da45;
        pXVar5 = X509_get_subject_name(pXVar4);
        pcStack_1040 = (code *)0x10da58;
        pcVar6 = X509_NAME_oneline(pXVar5,acStack_1038,0x400);
        pcStack_1040 = (code *)0x10da6c;
        printf("%s: found certificate with\n  subject: \'%s\'\n",pcVar7,pcVar6);
        pcStack_1040 = (code *)0x10da74;
        pXVar5 = X509_get_issuer_name(pXVar4);
        pcStack_1040 = (code *)0x10da84;
        pcVar7 = X509_NAME_oneline(pXVar5,acStack_1038,0x400);
        pcStack_1040 = (code *)0x10da95;
        printf("  issuer: %s\n",pcVar7);
        pcStack_1040 = (code *)0x10daa1;
        pXVar5 = (X509_NAME *)X509_REQ_get_subject_name(request);
        pcStack_1040 = (code *)0x10dab1;
        pcVar7 = X509_NAME_oneline(pXVar5,acStack_1038,0x400);
        pcStack_1040 = (code *)0x10dac2;
        printf("  request_subject: \'%s\'\n",pcVar7);
        unaff_RBP = acStack_1038;
      }
      pcStack_1040 = (code *)0x10daca;
      pXVar5 = X509_get_subject_name(pXVar4);
      pcStack_1040 = (code *)0x10dad9;
      b = (X509_NAME *)X509_REQ_get_subject_name(request);
      pcStack_1040 = (code *)0x10dae4;
      iVar3 = X509_NAME_cmp(pXVar5,b);
      if (d_flag != 0) {
        pcStack_1040 = (code *)0x10dbc5;
        write_local_cert_cold_1();
      }
      if (iVar3 == 0) {
LAB_0010db6a:
        if (v_flag != 0) {
          pcStack_1040 = (code *)0x10db7d;
          puts("CN\'s of request and certificate matched!");
        }
      }
      else {
        pcStack_1040 = (code *)0x10db04;
        pXVar5 = X509_get_subject_name(pXVar4);
        pcStack_1040 = (code *)0x10db1c;
        X509_NAME_oneline(pXVar5,local_838,0x400);
        pcStack_1040 = (code *)0x10db28;
        pXVar5 = (X509_NAME *)X509_REQ_get_subject_name(request);
        unaff_RBP = local_c38;
        pcStack_1040 = (code *)0x10db40;
        X509_NAME_oneline(pXVar5,unaff_RBP,0x400);
        if (v_flag != 0) {
          pcStack_1040 = (code *)0x10db5b;
          printf(" X509_NAME_cmp() workaround: strcmp request subject (%s) to cert subject (%s)\n",
                 unaff_RBP,local_838);
        }
        pcStack_1040 = (code *)0x10db66;
        iVar3 = strcmp(local_838,unaff_RBP);
        if (iVar3 == 0) goto LAB_0010db6a;
        pcStack_1040 = (code *)0x10dbcf;
        write_local_cert_cold_2();
      }
      pcStack_1040 = (code *)0x10db85;
      unaff_R15 = (FILE *)X509_get_subject_name(pXVar4);
      pcStack_1040 = (code *)0x10db90;
      pXVar5 = X509_get_issuer_name(pXVar4);
      pcStack_1040 = (code *)0x10db9b;
      pFVar15 = unaff_R15;
      iVar3 = X509_NAME_cmp((X509_NAME *)unaff_R15,pXVar5);
      if (iVar3 != 0) break;
      uVar2 = (int)unaff_R14 + 1;
      unaff_R14 = (char **)(ulong)uVar2;
      pcStack_1040 = (code *)0x10dbaa;
      pFVar15 = pFVar9;
      iVar3 = OPENSSL_sk_num();
      pXVar4 = (X509 *)localcert;
    } while ((int)uVar2 < iVar3);
  }
  localcert = (X509 *)pXVar4;
  pXVar18 = localcert;
  if (localcert == (X509 *)0x0) {
    pcStack_1040 = (code *)0x10dc7f;
    write_local_cert_cold_5();
  }
  else {
    unaff_R14 = &l_char;
    pcStack_1040 = (code *)0x10dc00;
    pFVar15 = (FILE *)l_char;
    pFVar8 = fopen(l_char,"w");
    if (pFVar8 != (FILE *)0x0) {
      if (v_flag != 0) {
        pcStack_1040 = (code *)0x10dc2a;
        printf("%s: certificate written as %s\n",pname,l_char);
      }
      if (d_flag != 0) {
        pcStack_1040 = (code *)0x10dc4c;
        PEM_write_X509(_stdout,(X509 *)localcert);
      }
      pcStack_1040 = (code *)0x10dc5b;
      pFVar15 = pFVar8;
      iVar3 = PEM_write_X509(pFVar8,(X509 *)localcert);
      pFVar9 = pFVar8;
      if (iVar3 == 1) {
        pcStack_1040 = (code *)0x10dc68;
        fclose(pFVar8);
        return;
      }
      goto LAB_0010dc84;
    }
  }
  pcStack_1040 = (code *)0x10dc84;
  write_local_cert_cold_4();
LAB_0010dc84:
  pcStack_1040 = write_other_cert;
  write_local_cert_cold_3();
  piStack_1060 = &v_flag;
  uVar14 = *(undefined8 *)(*(long *)(pFVar15->__pad5 + 0x20) + 0x10);
  pcStack_1478 = (code *)0x10dcb4;
  pFStack_1068 = pFVar9;
  pXStack_1058 = pXVar18;
  ppcStack_1050 = unaff_R14;
  pFStack_1048 = unaff_R15;
  pcStack_1040 = (code *)unaff_RBP;
  iVar3 = OPENSSL_sk_num(uVar14);
  piVar16 = &v_flag;
  if (0 < iVar3) {
    pXVar18 = (X509 *)0x0;
    do {
      pcStack_1478 = (code *)0x10dccd;
      pFVar9 = (FILE *)OPENSSL_sk_value(uVar14,pXVar18);
      pcVar7 = pname;
      if (v_flag != 0) {
        pcStack_1478 = (code *)0x10dcee;
        pXVar5 = X509_get_subject_name((X509 *)pFVar9);
        pcStack_1478 = (code *)0x10dcfe;
        pcVar6 = X509_NAME_oneline(pXVar5,(char *)aiStack_1470,0x400);
        pcStack_1478 = (code *)0x10dd12;
        printf("%s: found certificate with\n  subject: %s\n",pcVar7,pcVar6);
        pcStack_1478 = (code *)0x10dd1a;
        pXVar5 = X509_get_issuer_name((X509 *)pFVar9);
        pcStack_1478 = (code *)0x10dd2a;
        pcVar6 = X509_NAME_oneline(pXVar5,(char *)aiStack_1470,0x400);
        pcStack_1478 = (code *)0x10dd3b;
        printf("  issuer: %s\n",pcVar6);
        unaff_RBP = pcVar7;
      }
      pcStack_1478 = (code *)0x10dd43;
      x = X509_get_serialNumber((X509 *)pFVar9);
      pcStack_1478 = (code *)0x10dd56;
      iVar3 = ASN1_INTEGER_cmp(x,*(ASN1_INTEGER **)((long)pFVar15->__pad3 + 8));
      piVar16 = aiStack_1470;
      if (iVar3 == 0) goto LAB_0010dd73;
      uVar2 = (int)pXVar18 + 1;
      pXVar18 = (X509 *)(ulong)uVar2;
      pcStack_1478 = (code *)0x10dd65;
      iVar3 = OPENSSL_sk_num(uVar14);
      piVar16 = aiStack_1470;
    } while ((int)uVar2 < iVar3);
  }
  do {
    pcStack_1478 = (code *)0x10dd73;
    write_other_cert_cold_3();
LAB_0010dd73:
  } while (pFVar9 == (FILE *)0x0);
  pcStack_1478 = (code *)0x10dd8e;
  pFVar8 = (FILE *)w_char;
  fp = fopen(w_char,"w");
  if (fp == (FILE *)0x0) {
    pcStack_1478 = (code *)0x10de0a;
    write_other_cert_cold_2();
  }
  else {
    if (v_flag != 0) {
      pcStack_1478 = (code *)0x10ddbd;
      printf("%s: certificate written as %s\n",pname,w_char);
    }
    if (d_flag != 0) {
      pcStack_1478 = (code *)0x10dddb;
      PEM_write_X509(_stdout,(X509 *)pFVar9);
    }
    pcStack_1478 = (code *)0x10dde6;
    pFVar8 = fp;
    iVar3 = PEM_write_X509(fp,(X509 *)pFVar9);
    pFVar15 = fp;
    if (iVar3 == 1) {
      pcStack_1478 = (code *)0x10ddf3;
      fclose(fp);
      return;
    }
  }
  pcStack_1478 = write_ca_ra;
  write_other_cert_cold_1();
  ppcStack_1480 = &w_char;
  pFStack_14a0 = pFVar9;
  piStack_1498 = piVar16;
  pXStack_1490 = pXVar18;
  pFStack_1488 = pFVar15;
  pcStack_1478 = (code *)unaff_RBP;
  bp = BIO_new_mem_buf(pFVar8->_IO_read_end,*(int *)&pFVar8->_IO_read_base);
  pPVar10 = d2i_PKCS7_bio(bp,(PKCS7 **)0x0);
  if (pPVar10 == (PKCS7 *)0x0) {
    pcVar7 = "%s: error reading PKCS#7 data\n";
LAB_0010de5c:
    fprintf(_stderr,pcVar7,pname);
LAB_0010de66:
    ERR_print_errors_fp(_stderr);
  }
  else {
    iVar3 = OBJ_obj2nid(pPVar10->type);
    if (iVar3 == 0x16) {
      lVar17 = ((pPVar10->d).data)->flags;
      if (lVar17 != 0) {
        pPStack_1d00 = pPVar10;
        pBStack_1cf8 = bp;
        iVar3 = OPENSSL_sk_num(lVar17);
        if (0 < iVar3) {
          uVar19 = 0;
          lStack_1cf0 = lVar17;
          do {
            memset(acStack_18a8,0,0x400);
            memset(acStack_1ca8,0,0x400);
            pXVar4 = (X509 *)OPENSSL_sk_value(lVar17,uVar19);
            snprintf(acStack_1ca8,0x400,"%s-%d",c_char,uVar19);
            pcVar7 = pname;
            if (v_flag != 0) {
              pXVar5 = X509_get_subject_name(pXVar4);
              pcVar6 = X509_NAME_oneline(pXVar5,acStack_18a8,0x400);
              printf("\n%s: found certificate with\n  subject: %s\n",pcVar7,pcVar6);
              if (v_flag != 0) {
                pXVar5 = X509_get_issuer_name(pXVar4);
                pcVar7 = X509_NAME_oneline(pXVar5,acStack_18a8,0x400);
                printf("  issuer: %s\n",pcVar7);
              }
            }
            iVar3 = X509_digest(pXVar4,(EVP_MD *)fp_alg,abStack_1ce8,&uStack_1d04);
            if (iVar3 == 0) goto LAB_0010de66;
            iVar3 = X509_get_ext_by_NID(pXVar4,0x57,-1);
            if (iVar3 < 0) {
              if (v_flag != 0) {
                puts("  basic constraints: (not included)");
              }
            }
            else {
              pXVar11 = X509_get_ext(pXVar4,iVar3);
              if (v_flag != 0) {
                printf("  basic constraints: ");
                X509V3_EXT_print_fp(_stdout,pXVar11,0,0);
                putchar(10);
              }
            }
            iVar3 = X509_get_ext_by_NID(pXVar4,0x53,-1);
            if (iVar3 < 0) {
              if (v_flag != 0) {
                puts("  usage: (not included)");
                goto LAB_0010e0d7;
              }
            }
            else {
              pXVar11 = X509_get_ext(pXVar4,iVar3);
              if (v_flag != 0) {
                printf("  usage: ");
                X509V3_EXT_print_fp(_stdout,pXVar11,0,0);
                putchar(10);
LAB_0010e0d7:
                if (v_flag != 0) {
                  iVar3 = EVP_MD_get_type(fp_alg);
                  pcVar7 = OBJ_nid2sn(iVar3);
                  printf("  %s fingerprint: ",pcVar7);
                  uVar13 = (ulong)uStack_1d04;
                  if (0 < (int)uStack_1d04) {
                    uVar12 = 0;
                    do {
                      uVar1 = uVar12 + 1;
                      uVar14 = 10;
                      if (uVar1 != (uVar13 & 0xffffffff)) {
                        uVar14 = 0x3a;
                      }
                      printf("%02X%c",(ulong)abStack_1ce8[uVar12],uVar14);
                      uVar13 = (ulong)(int)uStack_1d04;
                      uVar12 = uVar1;
                    } while ((long)uVar1 < (long)uVar13);
                  }
                }
              }
            }
            pFVar9 = fopen(acStack_1ca8,"w");
            if (pFVar9 == (FILE *)0x0) {
              pcVar7 = "%s: cannot open cert file for writing\n";
              goto LAB_0010dea6;
            }
            if (v_flag != 0) {
              printf("%s: certificate written as %s\n",pname,acStack_1ca8);
            }
            if (d_flag != 0) {
              PEM_write_X509(_stdout,pXVar4);
            }
            iVar3 = PEM_write_X509(pFVar9,pXVar4);
            if (iVar3 != 1) {
              pcVar7 = "%s: error while writing certificate file\n";
              goto LAB_0010de5c;
            }
            fclose(pFVar9);
            lVar17 = lStack_1cf0;
            uVar2 = (int)uVar19 + 1;
            uVar19 = (ulong)uVar2;
            iVar3 = OPENSSL_sk_num(lStack_1cf0);
          } while ((int)uVar2 < iVar3);
        }
        PKCS7_free(pPStack_1d00);
        BIO_free(pBStack_1cf8);
        exit(0);
      }
      pcVar7 = "%s: cannot find certificates\n";
LAB_0010dea6:
      fprintf(_stderr,pcVar7,pname);
    }
    else {
      printf("%s: wrong PKCS#7 type\n",pname);
    }
  }
  exit(0x5d);
}

Assistant:

void
write_local_cert(struct scep *s) {
	PKCS7			*p7;
	STACK_OF(X509)		*certs;
	X509			*cert = NULL;
	FILE			*fp;
	int			i;

	localcert = NULL;

	/* Get certs */
	p7 = s->reply_p7;
	certs = p7->d.sign->cert;
       
        if (v_flag) {
		printf ("write_local_cert(): found %d cert(s)\n", sk_X509_num(certs));
        }

	/* Find cert */
	for (i = 0; i < sk_X509_num(certs); i++) {
		char buffer[1024];
		cert = sk_X509_value(certs, i);
		if (v_flag) {
			printf("%s: found certificate with\n"
				"  subject: '%s'\n", pname,
				X509_NAME_oneline(X509_get_subject_name(cert),
					buffer, sizeof(buffer)));
			printf("  issuer: %s\n", 
				X509_NAME_oneline(X509_get_issuer_name(cert),
					buffer, sizeof(buffer)));
			printf("  request_subject: '%s'\n", 
				X509_NAME_oneline(X509_REQ_get_subject_name(request),
                                        buffer, sizeof(buffer)));
		}
		/* The subject has to match that of our request */
		if (!compare_subject(cert)) {
			
			if (v_flag)
				printf ("CN's of request and certificate matched!\n");
		} else {
			fprintf(stderr, "%s: Subject of our request does not match that of the returned Certificate!\n", pname);
			//exit (SCEP_PKISTATUS_FILE);
		}
		
		/* The subject cannot be the issuer (selfsigned) */
		if (X509_NAME_cmp(X509_get_subject_name(cert),
			X509_get_issuer_name(cert))) {
				localcert = cert;
				break;
		}
	}
	if (localcert == NULL) {
		fprintf(stderr, "%s: cannot find requested certificate\n",
				pname);
		exit (SCEP_PKISTATUS_FILE);

	}
	/* Write PEM-formatted file: */
#ifdef WIN32
	if ((fopen_s(&fp, l_char, "w")))
#else
	if (!(fp = fopen(l_char, "w")))
#endif
	{
		fprintf(stderr, "%s: cannot open cert file for writing\n",
				pname);
		exit (SCEP_PKISTATUS_FILE);
	}
	if (v_flag)
		printf("%s: certificate written as %s\n", pname, l_char);
	if (d_flag)
		PEM_write_X509(stdout, localcert);
	if (PEM_write_X509(fp, localcert) != 1) {
		fprintf(stderr, "%s: error while writing certificate "
			"file\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_FILE);
	}
	(void)fclose(fp);
}